

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

void __thiscall
FOptionMenuFieldBase::FOptionMenuFieldBase
          (FOptionMenuFieldBase *this,char *label,char *menu,char *graycheck)

{
  FBaseCVar *pFVar1;
  FName local_24;
  
  FName::NameManager::FindName(&FName::NameData,menu,false);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_24,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuItem_00865e98;
  pFVar1 = FindCVar(FName::NameData.NameArray
                    [(this->super_FOptionMenuItem).super_FListMenuItem.mAction.Index].Text,
                    (FBaseCVar **)0x0);
  this->mCVar = pFVar1;
  if ((graycheck == (char *)0x0) || (*graycheck == '\0')) {
    pFVar1 = (FBaseCVar *)0x0;
  }
  else {
    pFVar1 = FindCVar(graycheck,(FBaseCVar **)0x0);
  }
  this->mGrayCheck = pFVar1;
  return;
}

Assistant:

FOptionMenuFieldBase ( const char* label, const char* menu, const char* graycheck ) :
		FOptionMenuItem ( label, menu ),
		mCVar ( FindCVar( mAction, NULL )),
		mGrayCheck (( graycheck && strlen( graycheck )) ? FindCVar( graycheck, NULL ) : NULL ) {}